

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GdlFeatures.h
# Opt level: O2

void __thiscall GdlFeatureSetting::AddExtName(GdlFeatureSetting *this,utf16 wLangID,wstring *stu)

{
  wstring wStack_88;
  GdlExtName local_68;
  
  std::__cxx11::wstring::wstring((wstring *)&wStack_88,(wstring *)stu);
  GdlExtName::GdlExtName(&local_68,&wStack_88,wLangID);
  std::vector<GdlExtName,_std::allocator<GdlExtName>_>::emplace_back<GdlExtName>
            (&this->m_vextname,&local_68);
  GdlExtName::~GdlExtName(&local_68);
  std::__cxx11::wstring::~wstring((wstring *)&wStack_88);
  return;
}

Assistant:

void AddExtName(utf16 wLangID, std::wstring stu)
	{
		m_vextname.push_back(GdlExtName(stu, wLangID));
	}